

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

bool __thiscall
cmOutputConverter::Shell_ArgumentNeedsQuotes(cmOutputConverter *this,string_view in,int flags)

{
  byte *end;
  bool bVar1;
  byte *c;
  uint uVar2;
  uint flags_00;
  bool bVar3;
  byte *pbVar4;
  
  pbVar4 = (byte *)in._M_len;
  bVar3 = true;
  if (this != (cmOutputConverter *)0x0) {
    flags_00 = (uint)in._M_str;
    end = pbVar4 + (long)this;
    c = pbVar4;
    do {
      if ((((undefined1  [16])in & (undefined1  [16])0x40) != (undefined1  [16])0x0) &&
         (c = (byte *)Shell_SkipMakeVariables((iterator)c,(iterator)end), c == end)) break;
      bVar1 = Shell_CharNeedsQuotes(*c,flags_00);
      if (bVar1) {
        return true;
      }
      c = c + 1;
    } while (c != end);
    if (this == (cmOutputConverter *)&DAT_00000001 && (flags_00 >> 8 & 1) != 0) {
      uVar2 = *pbVar4 - 0x23;
      if ((uVar2 < 0x3c) && ((0x800000010000009U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
        return true;
      }
      if (*pbVar4 == 0x7c) {
        return true;
      }
    }
    if (((this == (cmOutputConverter *)&DAT_00000001 || (~flags_00 & 0x11) != 0) ||
        (*pbVar4 != 0x5c)) || (pbVar4[1] != 0x5c)) {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool cmOutputConverter::Shell_ArgumentNeedsQuotes(cm::string_view in,
                                                  int flags)
{
  /* The empty string needs quotes.  */
  if (in.empty()) {
    return true;
  }

  /* Scan the string for characters that require quoting.  */
  for (cm::string_view::iterator cit = in.begin(), cend = in.end();
       cit != cend; ++cit) {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if (flags & Shell_Flag_AllowMakeVariables) {
#if KWSYS_SYSTEM_SHELL_QUOTE_MAKE_VARIABLES
      cm::string_view::iterator skip = Shell_SkipMakeVariables(cit, cend);
      if (skip != cit) {
        /* We need to quote make variable references to preserve the
           string with contents substituted in its place.  */
        return true;
      }
#else
      /* Skip over the make variable references if any are present.  */
      cit = Shell_SkipMakeVariables(cit, cend);

      /* Stop if we have reached the end of the string.  */
      if (cit == cend) {
        break;
      }
#endif
    }

    /* Check whether this character needs quotes.  */
    if (Shell_CharNeedsQuotes(*cit, flags)) {
      return true;
    }
  }

  /* On Windows some single character arguments need quotes.  */
  if (flags & Shell_Flag_IsUnix && in.size() == 1) {
    char c = in[0];
    if ((c == '?') || (c == '&') || (c == '^') || (c == '|') || (c == '#')) {
      return true;
    }
  }

  /* UNC paths in MinGW Makefiles need quotes.  */
  if ((flags & Shell_Flag_MinGWMake) && (flags & Shell_Flag_Make)) {
    if (in.size() > 1 && in[0] == '\\' && in[1] == '\\') {
      return true;
    }
  }

  return false;
}